

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrerequisiteTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::ReadPixelsCase::iterate(ReadPixelsCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum err;
  PixelFormat *pPVar3;
  RenderContext *context;
  TestLog *pTVar4;
  int iVar5;
  byte local_4d1;
  deUint32 *local_4d0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  LogImage local_430;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  LogImage local_350;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  LogImage local_270;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  LogImageSet local_190;
  deUint32 local_14c;
  deUint32 local_148;
  deUint32 local_144;
  deUint32 local_140;
  byte local_139;
  deUint32 local_138;
  RGBA RStack_134;
  bool isPixelOk;
  RGBA refRGBA;
  RGBA resRGBA;
  int i;
  int j;
  bool isImageOk;
  RGBA diffColor;
  RGBA matchColor;
  RGBA colorThreshold;
  Vector<int,_4> local_f0;
  PixelBufferAccess local_e0;
  uint local_b4;
  uint local_b0;
  int b;
  int g;
  int r;
  Surface diffImage;
  undefined1 local_80 [8];
  Surface refImage;
  Surface resImage;
  deRandom rnd;
  int imageHeight;
  int imageWidth;
  int y;
  int x;
  int targetHeight;
  int targetWidth;
  PixelFormat pixelFormat;
  RenderTarget *renderTarget;
  ReadPixelsCase *this_local;
  
  pixelFormat._8_8_ = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat((RenderTarget *)pixelFormat._8_8_);
  targetHeight = pPVar3->redBits;
  unique0x10000689 = pPVar3->greenBits;
  pixelFormat.redBits = pPVar3->blueBits;
  pixelFormat.greenBits = pPVar3->alphaBits;
  rnd.w = tcu::RenderTarget::getWidth((RenderTarget *)pixelFormat._8_8_);
  rnd.z = tcu::RenderTarget::getHeight((RenderTarget *)pixelFormat._8_8_);
  dVar2 = ::deInt32Hash(this->m_curIter);
  deRandom_init((deRandom *)&resImage.m_pixels.m_cap,dVar2);
  iVar1 = this->m_curIter;
  if (iVar1 == 0) {
    imageWidth = 0;
    imageHeight = 0;
  }
  else if (iVar1 == 1) {
    imageWidth = 0;
    imageHeight = 0;
    rnd.w = (int)rnd.w / 2;
    rnd.z = (int)rnd.z / 2;
  }
  else if (iVar1 == 2) {
    imageWidth = (int)rnd.w / 2;
    imageHeight = (int)rnd.z / 2;
    rnd.w = rnd.w - imageWidth;
    rnd.z = rnd.z - imageHeight;
  }
  else {
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    imageWidth = dVar2 % (rnd.w - 1);
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    imageHeight = dVar2 % (rnd.z - 1);
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    rnd.w = dVar2 % ((rnd.w - imageWidth) - 1) + 1;
    dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
    rnd.z = dVar2 % ((rnd.z - imageHeight) - 1) + 1;
  }
  tcu::Surface::Surface((Surface *)&refImage.m_pixels.m_cap,rnd.w,rnd.z);
  tcu::Surface::Surface((Surface *)local_80,rnd.w,rnd.z);
  tcu::Surface::Surface((Surface *)&g,rnd.w,rnd.z);
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  b = dVar2 & 0xff;
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  local_b0 = dVar2 & 0xff;
  dVar2 = deRandom_getUint32((deRandom *)&resImage.m_pixels.m_cap);
  local_b4 = dVar2 & 0xff;
  tcu::Surface::getAccess(&local_e0,(Surface *)local_80);
  tcu::Vector<int,_4>::Vector(&local_f0,b,local_b0,local_b4,0xff);
  tcu::clear(&local_e0,&local_f0);
  glwClearColor((float)b / 255.0,(float)(int)local_b0 / 255.0,(float)(int)local_b4 / 255.0,1.0);
  glwClear(0x4000);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&matchColor,(Surface *)&refImage.m_pixels.m_cap);
  glu::readPixels(context,imageWidth,imageHeight,(PixelBufferAccess *)&matchColor);
  err = glwGetError();
  glu::checkError(err,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrerequisiteTests.cpp"
                  ,0xe8);
  diffColor = tcu::PixelFormat::getColorThreshold((PixelFormat *)&targetHeight);
  tcu::RGBA::RGBA((RGBA *)&stack0xfffffffffffffee0,0,0xff,0,0xff);
  tcu::RGBA::RGBA((RGBA *)&j,0xff,0,0,0xff);
  i._3_1_ = 1;
  for (resRGBA.m_value = 0; (int)resRGBA.m_value < (int)rnd.z; resRGBA.m_value = resRGBA.m_value + 1
      ) {
    for (refRGBA.m_value = 0; (int)refRGBA.m_value < (int)rnd.w;
        refRGBA.m_value = refRGBA.m_value + 1) {
      RStack_134 = tcu::Surface::getPixel
                             ((Surface *)&refImage.m_pixels.m_cap,refRGBA.m_value,resRGBA.m_value);
      local_140 = (deUint32)
                  tcu::Surface::getPixel((Surface *)local_80,refRGBA.m_value,resRGBA.m_value);
      local_144 = RStack_134.m_value;
      local_148 = diffColor.m_value;
      local_138 = local_140;
      local_139 = tcu::compareThreshold((RGBA)local_140,RStack_134,diffColor);
      if ((bool)local_139) {
        local_4d0 = (deUint32 *)&stack0xfffffffffffffee0;
      }
      else {
        local_4d0 = (deUint32 *)&j;
      }
      local_14c = *local_4d0;
      tcu::Surface::setPixel((Surface *)&g,refRGBA.m_value,resRGBA.m_value,(RGBA)local_14c);
      local_4d1 = 0;
      if (i._3_1_ != 0) {
        local_4d1 = local_139;
      }
      i._3_1_ = local_4d1 & 1;
    }
  }
  if (i._3_1_ == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Result",&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"Resulting framebuffer",&local_1d9);
    tcu::LogImageSet::LogImageSet(&local_190,&local_1b0,&local_1d8);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Result",&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"Resulting framebuffer",&local_2b9);
    tcu::LogImage::LogImage
              (&local_270,&local_290,&local_2b8,(Surface *)&refImage.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"Reference",&local_371);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"Reference image",&local_399);
    tcu::LogImage::LogImage
              (&local_350,&local_370,&local_398,(Surface *)local_80,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"DiffMask",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"Failing pixels",&local_479);
    tcu::LogImage::LogImage
              (&local_430,&local_450,&local_478,(Surface *)&g,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_430);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_430);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    tcu::LogImage::~LogImage(&local_350);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    tcu::LogImage::~LogImage(&local_270);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    tcu::LogImageSet::~LogImageSet(&local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  iVar5 = this->m_curIter + 1;
  this->m_curIter = iVar5;
  iVar1 = this->m_numIters;
  tcu::Surface::~Surface((Surface *)&g);
  tcu::Surface::~Surface((Surface *)local_80);
  tcu::Surface::~Surface((Surface *)&refImage.m_pixels.m_cap);
  return (uint)(iVar5 < iVar1);
}

Assistant:

TestCase::IterateResult ReadPixelsCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	tcu::PixelFormat			pixelFormat		= renderTarget.getPixelFormat();
	int							targetWidth		= renderTarget.getWidth();
	int							targetHeight	= renderTarget.getHeight();
	int							x				= 0;
	int							y				= 0;
	int							imageWidth		= 0;
	int							imageHeight		= 0;

	deRandom rnd;
	deRandom_init(&rnd, deInt32Hash(m_curIter));

	switch (m_curIter)
	{
		case 0:
			// Fullscreen
			x = 0;
			y = 0;
			imageWidth  = targetWidth;
			imageHeight = targetHeight;
			break;
		case 1:
			// Upper left corner
			x = 0;
			y = 0;
			imageWidth = targetWidth / 2;
			imageHeight = targetHeight / 2;
			break;
		case 2:
			// Lower right corner
			x = targetWidth / 2;
			y = targetHeight / 2;
			imageWidth = targetWidth - x;
			imageHeight = targetHeight - y;
			break;
		default:
			x = deRandom_getUint32(&rnd) % (targetWidth - 1);
			y = deRandom_getUint32(&rnd) % (targetHeight - 1);
			imageWidth = 1 + (deRandom_getUint32(&rnd) % (targetWidth - x - 1));
			imageHeight = 1 + (deRandom_getUint32(&rnd) % (targetHeight - y - 1));
			break;
	}

	Surface	resImage(imageWidth, imageHeight);
	Surface	refImage(imageWidth, imageHeight);
	Surface	diffImage(imageWidth, imageHeight);

	int r = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int g = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int b = (int)(deRandom_getUint32(&rnd) & 0xFF);

	tcu::clear(refImage.getAccess(), tcu::IVec4(r, g, b, 255));
	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	glu::readPixels(m_context.getRenderContext(), x, y, resImage.getAccess());
	GLU_CHECK_MSG("glReadPixels() failed.");

	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	bool isImageOk = true;

	for (int j = 0; j < imageHeight; j++)
	{
		for (int i = 0; i < imageWidth; i++)
		{
			RGBA		resRGBA		= resImage.getPixel(i, j);
			RGBA		refRGBA		= refImage.getPixel(i, j);
			bool		isPixelOk	= compareThreshold(refRGBA, resRGBA, colorThreshold);
			diffImage.setPixel(i, j, isPixelOk ? matchColor : diffColor);

			isImageOk = isImageOk && isPixelOk;
		}
	}

	if (isImageOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Resulting framebuffer")
						   << TestLog::Image("Result",		"Resulting framebuffer",	resImage)
						   << TestLog::Image("Reference",	"Reference image",			refImage)
						   << TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
						   << TestLog::EndImageSet;
	}

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}